

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  seqDef *psVar1;
  ushort uVar2;
  ZSTD_longLengthType_e ZVar3;
  U32 UVar4;
  bool bVar5;
  symbolEncodingType_e sVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  void *pvVar10;
  int iVar11;
  size_t err_code_1;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  byte *pbVar17;
  size_t sVar18;
  byte *pbVar19;
  ulong uVar20;
  long lVar21;
  size_t __n;
  size_t err_code;
  uint *count;
  U32 UVar22;
  U16 *pUVar23;
  ulong uVar24;
  byte *dst_00;
  U32 UVar25;
  U32 UVar26;
  ulong uVar27;
  uint uVar28;
  BYTE *source;
  uint uVar29;
  uint uVar30;
  undefined4 in_register_0000008c;
  ulong nbSeq;
  ZSTD_compressedBlockState_t *__dest;
  byte bVar31;
  size_t sVar32;
  byte *__dest_00;
  seqDef *psVar33;
  bool bVar34;
  undefined4 in_stack_fffffffffffffd88;
  undefined8 local_250;
  U32 local_248;
  byte *local_240;
  ZSTD_compressedBlockState_t *local_238;
  seqDef *local_230;
  ulong local_228;
  byte *local_220;
  long local_218;
  uint *local_210;
  ZSTD_CCtx *local_208;
  uint local_1fc;
  byte *local_1f8;
  byte *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  BYTE *local_1d8;
  BYTE *local_1d0;
  ZSTD_compressedBlockState_t *local_1c8;
  byte *local_1c0;
  undefined8 local_1b8;
  FSE_CTable *local_1b0;
  FSE_CTable *local_1a8;
  ZSTD_fseCTables_t *local_1a0;
  seqDef *local_198;
  seqDef *local_190;
  void *local_188;
  ulong local_180;
  seqDef *local_178;
  size_t local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1b8 = CONCAT44(in_register_0000008c,lastBlock);
  local_240 = (byte *)ZSTD_buildBlockEntropyStats
                                (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                                 &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                                 &entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (local_240 < (byte *)0xffffffffffffff89) {
    local_1c8 = (zc->blockState).prevCBlock;
    __dest = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    local_190 = (zc->seqStore).sequencesStart;
    local_198 = (zc->seqStore).sequences;
    source = (zc->seqStore).litStart;
    local_1d0 = (zc->seqStore).lit;
    local_1f0 = (byte *)src;
    local_1c0 = (byte *)(srcSize + (long)src);
    local_218 = dstCapacity + (long)dst;
    local_1d8 = (zc->seqStore).llCode;
    local_1e0 = (zc->seqStore).mlCode;
    local_1e8 = (zc->seqStore).ofCode;
    local_170 = (zc->appliedParams).targetCBlockSize;
    uVar30 = (uint)(entropyMetadata.hufMetadata.hType == set_compressed);
    local_180 = (ulong)(uint)zc->bmi2;
    local_1fc = (uint)(zc->bmi2 != 0);
    local_178 = local_198 + -1;
    local_1a0 = &(__dest->entropy).fse;
    local_1a8 = (__dest->entropy).fse.litlengthCTable;
    local_1b0 = (__dest->entropy).fse.matchlengthCTable;
    bVar8 = true;
    nbSeq = 0;
    uVar12 = 0;
    local_188 = dst;
    local_230 = local_190;
    local_208 = zc;
    local_210 = count;
    local_238 = __dest;
    local_240 = (byte *)dst;
    do {
      if (local_190 == local_198) {
        bVar34 = true;
        uVar27 = uVar12;
      }
      else {
        psVar1 = local_230 + nbSeq;
        bVar34 = psVar1 == local_178;
        uVar2 = psVar1->litLength;
        uVar29 = (uint)uVar2;
        if ((local_208->seqStore).longLengthPos ==
            (U32)((ulong)((long)psVar1 - (long)(local_208->seqStore).sequencesStart) >> 3)) {
          uVar29 = uVar2 + 0x10000;
          if ((local_208->seqStore).longLengthType != ZSTD_llt_literalLength) {
            uVar29 = (uint)uVar2;
          }
        }
        nbSeq = nbSeq + 1;
        uVar27 = uVar12 + uVar29;
      }
      uVar12 = uVar27;
      if (bVar34 != false) {
        if (local_1d0 < source) {
          __assert_fail("lp <= lend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed3,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        uVar12 = (long)local_1d0 - (long)source;
        if (uVar12 < uVar27) {
          __assert_fail("litSize <= (size_t)(lend - lp)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed4,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
      }
      local_250 = CONCAT44(local_250._4_4_,0xff);
      in_stack_fffffffffffffd88 = CONCAT13(bVar34,(int3)in_stack_fffffffffffffd88);
      sVar32 = uVar12;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        sVar18 = HIST_count_wksp(count,(uint *)&local_250,source,uVar12,count,0x22d8);
        if (sVar18 < 0xffffffffffffff89) {
          if ((int)(uint)local_250 < 0) {
            lVar16 = 3;
          }
          else {
            lVar16 = 0;
            uVar27 = 0;
            do {
              uVar27 = uVar27 + (ulong)count[lVar16] *
                                (ulong)(byte)(__dest->entropy).huf.CTable[lVar16 + 1];
              lVar16 = lVar16 + 1;
            } while ((local_250 & 0xffffffff) + 1 != lVar16);
            lVar16 = (uVar27 >> 3) + 3;
          }
          sVar32 = entropyMetadata.hufMetadata.hufDesSize;
          if (uVar30 == 0) {
            sVar32 = 0;
          }
          sVar32 = lVar16 + sVar32;
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType != set_rle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4e3d,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        sVar32 = 1;
      }
      if (nbSeq == 0) {
        lVar16 = 3;
        bVar31 = (byte)((uint)in_stack_fffffffffffffd88 >> 0x18);
      }
      else {
        sVar13 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.ofType,local_1e8,0x1f,nbSeq,
                            local_1a0->offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,count,
                            CONCAT44(uVar30,in_stack_fffffffffffffd88));
        sVar14 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.llType,local_1d8,0x23,nbSeq,local_1a8,"",
                            LL_defaultNorm,6,0x23,count,CONCAT44(uVar30,in_stack_fffffffffffffd88));
        sVar15 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,local_1e0,0x34,nbSeq,local_1b0,"",
                            ML_defaultNorm,6,0x34,count,CONCAT44(uVar30,in_stack_fffffffffffffd88));
        sVar18 = 0;
        if (bVar8) {
          sVar18 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar16 = sVar18 + sVar13 + sVar14 + sVar15 + 3;
        bVar31 = (byte)((uint)in_stack_fffffffffffffd88 >> 0x18);
        count = local_210;
        __dest = local_238;
      }
      bVar34 = true;
      pbVar17 = local_220;
      if ((~bVar31 & lVar16 + sVar32 + 3 <= local_170) == 0) {
        if ((long)nbSeq < 1) {
          uVar27 = 0;
          lVar16 = 0;
        }
        else {
          uVar20 = (long)local_230 - (long)(local_208->seqStore).sequencesStart;
          lVar21 = nbSeq * 8;
          pUVar23 = &local_230->mlBase;
          lVar16 = 0;
          uVar27 = 0;
          do {
            uVar2 = pUVar23[-1];
            uVar28 = (uint)uVar2;
            uVar29 = *pUVar23 + 3;
            if ((local_208->seqStore).longLengthPos == (U32)(uVar20 >> 3)) {
              ZVar3 = (local_208->seqStore).longLengthType;
              uVar28 = uVar2 + 0x10000;
              if (ZVar3 != ZSTD_llt_literalLength) {
                uVar28 = (uint)uVar2;
              }
              if (ZVar3 == ZSTD_llt_matchLength) {
                uVar29 = *pUVar23 + 0x10003;
              }
            }
            lVar16 = lVar16 + (ulong)uVar29;
            uVar27 = uVar27 + uVar28;
            uVar20 = uVar20 + 8;
            lVar21 = lVar21 + -8;
            pUVar23 = pUVar23 + 4;
          } while (0 < lVar21);
        }
        if (uVar12 < uVar27) {
          __assert_fail("litLengthSum <= litSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4d89,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        if (uVar27 != uVar12 && bVar31 == 0) {
          __assert_fail("litLengthSum == litSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4d8b,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        bVar34 = (int)local_1b8 != 0;
        sVar32 = (local_218 - (long)local_240) - 3;
        lVar21 = 0;
        if (uVar30 != 0) {
          lVar21 = 200;
        }
        dst_00 = local_240 + 3;
        sVar6 = entropyMetadata.hufMetadata.hType;
        if (uVar30 == 0) {
          sVar6 = set_repeat;
        }
        lVar21 = (ulong)(0x4000U - lVar21 <= uVar12) - (ulong)(uVar12 < 0x400U - lVar21);
        pbVar19 = dst_00;
        if (uVar12 == 0) {
LAB_0015d618:
          pbVar17 = (byte *)ZSTD_noCompressLiterals(dst_00,sVar32,source,uVar12);
LAB_0015d7ae:
          uVar27 = CONCAT71((int7)((ulong)pbVar19 >> 8),1);
        }
        else {
          if (1 < entropyMetadata.hufMetadata.hType - set_compressed) {
            if (entropyMetadata.hufMetadata.hType != set_rle) {
              if (entropyMetadata.hufMetadata.hType != set_basic) {
                __assert_fail("hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x4d3d,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
              goto LAB_0015d618;
            }
            pbVar17 = (byte *)ZSTD_compressRleLiteralsBlock(dst_00,sVar32,source,uVar12);
            goto LAB_0015d7ae;
          }
          pbVar17 = local_240 + lVar21 + 7;
          if (entropyMetadata.hufMetadata.hType == set_compressed && uVar30 != 0) {
            memcpy(pbVar17,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            local_228 = entropyMetadata.hufMetadata.hufDesSize;
            pbVar17 = pbVar17 + entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_228 = 0;
          }
          uVar20 = lVar21 + 4;
          pbVar19 = pbVar17;
          if (uVar20 == 3) {
            sVar18 = HUF_compress1X_usingCTable_internal
                               (pbVar17,local_218 - (long)pbVar17,source,uVar12,
                                (HUF_CElt *)local_238,local_1fc);
          }
          else {
            sVar18 = HUF_compress4X_usingCTable_internal
                               (pbVar17,local_218 - (long)pbVar17,source,uVar12,
                                (HUF_CElt *)local_238,local_1fc);
          }
          local_1f8 = pbVar17;
          uVar24 = local_228 + sVar18;
          if (sVar18 - 1 < 0xffffffffffffff88) {
            if ((uVar30 != 0) || (uVar24 < uVar12)) {
              bVar5 = true;
              if (((ulong)(0x3ff < uVar24) - (ulong)(uVar24 < 0x4000)) + 4 <= uVar20)
              goto LAB_0015d752;
              if (uVar24 <= uVar12) {
                __assert_fail("cLitSize > litSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x4d56,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
            }
            pbVar19 = dst_00;
            pbVar17 = (byte *)ZSTD_noCompressLiterals(dst_00,sVar32,source,uVar12);
            bVar5 = false;
          }
          else {
            bVar5 = false;
            pbVar17 = (byte *)0x0;
          }
LAB_0015d752:
          uVar27 = CONCAT71((int7)((ulong)pbVar19 >> 8),1);
          if (bVar5) {
            iVar11 = (int)uVar12;
            uVar29 = (uint)uVar24;
            if (uVar20 == 5) {
              *(symbolEncodingType_e *)(local_240 + 3) =
                   uVar29 * 0x400000 + sVar6 + iVar11 * 0x10 + 0xc;
              local_240[7] = (byte)(uVar29 >> 10);
            }
            else if (uVar20 == 4) {
              *(symbolEncodingType_e *)dst_00 = uVar29 * 0x40000 + sVar6 + iVar11 * 0x10 + 8;
            }
            else {
              iVar11 = iVar11 * 0x10 + (uint)(uVar20 != 3) * 4 + sVar6 + uVar29 * 0x4000;
              *(short *)(local_240 + 3) = (short)iVar11;
              local_240[5] = (byte)((uint)iVar11 >> 0x10);
            }
            pbVar17 = local_1f8 + (sVar18 - (long)dst_00);
            uVar27 = 0;
          }
        }
        bVar5 = false;
        if (pbVar17 < (byte *)0xffffffffffffff89) {
          if (pbVar17 == (byte *)0x0) {
            bVar7 = false;
            pbVar17 = (byte *)0x0;
          }
          else {
            dst_00 = dst_00 + (long)pbVar17;
            bVar7 = true;
          }
        }
        else {
          bVar7 = false;
        }
        bVar31 = (byte)((uint)in_stack_fffffffffffffd88 >> 0x18);
        if (bVar7) {
          uVar29 = (local_208->appliedParams).cParams.windowLog;
          pbVar19 = (byte *)0xffffffffffffffba;
          bVar5 = false;
          if (3 < local_218 - (long)dst_00) {
            if (nbSeq < 0x7f) {
              pbVar19 = dst_00 + 1;
              *dst_00 = (byte)nbSeq;
            }
            else if (nbSeq < 0x7f00) {
              *dst_00 = (byte)(nbSeq >> 8) | 0x80;
              dst_00[1] = (byte)nbSeq;
              pbVar19 = dst_00 + 2;
            }
            else {
              *dst_00 = 0xff;
              *(short *)(dst_00 + 1) = (short)nbSeq + -0x7f00;
              pbVar19 = dst_00 + 3;
            }
            if (nbSeq == 0) {
              pbVar19 = pbVar19 + -(long)dst_00;
            }
            else {
              local_228 = CONCAT44(local_228._4_4_,(int)uVar27);
              __dest_00 = pbVar19 + 1;
              local_1f8 = pbVar19;
              if (bVar8) {
                *pbVar19 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                           (char)(entropyMetadata.fseMetadata.llType << 6) +
                           (char)entropyMetadata.fseMetadata.mlType * '\x04';
                memcpy(__dest_00,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                __dest_00 = __dest_00 + entropyMetadata.fseMetadata.fseTablesSize;
              }
              else {
                *pbVar19 = 0xfc;
              }
              pbVar19 = (byte *)ZSTD_encodeSequences
                                          (__dest_00,local_218 - (long)__dest_00,local_1b0,local_1e0
                                           ,local_1a0->offcodeCTable,local_1e8,local_1a8,local_1d8,
                                           local_230,nbSeq,(uint)(0x39 < uVar29),(int)local_180);
              bVar5 = false;
              bVar31 = (byte)((uint)in_stack_fffffffffffffd88 >> 0x18);
              if (pbVar19 < (byte *)0xffffffffffffff89) {
                __dest_00 = __dest_00 + (long)pbVar19;
                bVar7 = true;
                if (((bVar8) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
                   (pbVar19 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
                  if (pbVar19 + entropyMetadata.fseMetadata.lastCountSize != (byte *)0x3) {
                    __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x4ddf,
                                  "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                                 );
                  }
                  bVar7 = false;
                  pbVar19 = (byte *)0x0;
                }
              }
              else {
                bVar7 = false;
              }
              uVar27 = local_228 & 0xffffffff;
              if (bVar7) {
                pbVar19 = __dest_00 + -(long)dst_00;
                bVar5 = 3 < (long)__dest_00 - (long)local_1f8;
                if ((long)__dest_00 - (long)local_1f8 < 4) {
                  pbVar19 = (byte *)0x0;
                }
              }
            }
          }
          if (pbVar19 < (byte *)0xffffffffffffff89) {
            if (pbVar19 == (byte *)0x0) {
              bVar7 = false;
              pbVar17 = (byte *)0x0;
            }
            else {
              dst_00 = dst_00 + (long)pbVar19;
              bVar7 = true;
            }
          }
          else {
            bVar7 = false;
            pbVar17 = pbVar19;
          }
          if (bVar7) {
            pbVar17 = dst_00 + -(long)local_240;
            iVar11 = (bVar34 & bVar31 | 0xffffffec) + (int)pbVar17 * 8;
            *(short *)local_240 = (short)iVar11;
            local_240[2] = (byte)((uint)iVar11 >> 0x10);
          }
        }
        bVar34 = pbVar17 < (byte *)0xffffffffffffff89;
        count = local_210;
        __dest = local_238;
        if (bVar34) {
          if ((pbVar17 != (byte *)0x0) && (pbVar17 < (byte *)(lVar16 + uVar12))) {
            local_1f0 = local_1f0 + (long)(lVar16 + uVar12);
            if (local_1c0 < local_1f0) {
              __assert_fail("ip + decompressedSize <= iend",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4eef,
                            "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                           );
            }
            local_230 = local_230 + nbSeq;
            source = source + uVar12;
            local_240 = local_240 + (long)pbVar17;
            local_1d8 = local_1d8 + nbSeq;
            local_1e0 = local_1e0 + nbSeq;
            local_1e8 = local_1e8 + nbSeq;
            if ((char)uVar27 == '\0') {
              uVar30 = 0;
            }
            if (bVar5) {
              bVar8 = false;
            }
            nbSeq = 0;
            uVar12 = 0;
          }
          bVar34 = true;
          pbVar17 = local_220;
        }
      }
      local_220 = pbVar17;
      if (!bVar34) {
        return (size_t)local_220;
      }
    } while (bVar31 == 0);
    if (uVar30 != 0) {
      memcpy(__dest,local_1c8,0x810);
    }
    pvVar10 = local_188;
    psVar33 = local_190;
    psVar1 = local_230;
    if ((bVar8) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      local_240 = (byte *)0x0;
    }
    else {
      if (local_1f0 < local_1c0) {
        __n = (long)local_1c0 - (long)local_1f0;
        pbVar17 = (byte *)0xffffffffffffffba;
        if ((byte *)(__n + 3) <= (byte *)(local_218 - (long)local_240)) {
          iVar11 = (int)local_1b8 + (int)__n * 8;
          *(short *)local_240 = (short)iVar11;
          local_240[2] = (byte)((uint)iVar11 >> 0x10);
          memcpy(local_240 + 3,local_1f0,__n);
          pbVar17 = (byte *)(__n + 3);
        }
        if ((byte *)0xffffffffffffff88 < pbVar17) {
          local_220 = pbVar17;
        }
        if ((byte *)0xffffffffffffff88 >= pbVar17) {
          if (pbVar17 == (byte *)0x0) {
            __assert_fail("cSize != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4f12,
                          "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                         );
          }
          local_240 = local_240 + (long)pbVar17;
          if (psVar1 < local_198) {
            UVar26 = local_1c8->rep[2];
            local_248 = UVar26;
            local_250 = *(ulong *)local_1c8->rep;
            uVar9 = local_250;
            if (psVar33 < psVar1) {
              local_250._4_4_ = (U32)(local_250 >> 0x20);
              uVar12 = (long)psVar33 - (long)(local_208->seqStore).sequencesStart;
              UVar22 = (uint)local_250;
              UVar25 = local_250._4_4_;
              local_250 = uVar9;
              do {
                uVar2 = psVar33->litLength;
                uVar30 = (uint)uVar2;
                if (((local_208->seqStore).longLengthPos == (U32)(uVar12 >> 3)) &&
                   (uVar30 = uVar2 + 0x10000,
                   (local_208->seqStore).longLengthType != ZSTD_llt_literalLength)) {
                  uVar30 = (uint)uVar2;
                }
                uVar29 = psVar33->offBase;
                if (uVar29 < 4) {
                  if (uVar29 == 0) {
                    __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
                  }
                  uVar30 = (uVar29 + (uVar30 == 0)) - 1;
                  UVar4 = UVar22;
                  if (uVar30 != 0) {
                    if (uVar30 == 3) {
                      UVar4 = UVar22 - 1;
                    }
                    else {
                      UVar4 = *(U32 *)((long)&local_250 + (ulong)uVar30 * 4);
                    }
                    if (uVar30 == 1) {
                      UVar25 = UVar26;
                    }
                    UVar26 = UVar25;
                    local_248 = UVar26;
                    local_250 = CONCAT44(UVar22,UVar4);
                    UVar25 = UVar22;
                  }
                }
                else {
                  local_248 = UVar25;
                  local_250 = CONCAT44(UVar22,uVar29 - 3);
                  UVar4 = uVar29 - 3;
                  UVar26 = UVar25;
                  UVar25 = UVar22;
                }
                UVar22 = UVar4;
                psVar33 = psVar33 + 1;
                uVar12 = uVar12 + 8;
              } while (psVar33 < psVar1);
            }
            __dest->rep[2] = local_248;
            *(ulong *)__dest->rep = local_250;
          }
        }
        if ((byte *)0xffffffffffffff88 < pbVar17) {
          return (size_t)local_220;
        }
      }
      local_240 = local_240 + -(long)pvVar10;
    }
  }
  return (size_t)local_240;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}